

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void VW::sync_stats(vw *all)

{
  float fVar1;
  
  if (all->all_reduce != (AllReduce *)0x0) {
    fVar1 = accumulate_scalar(all,(float)all->sd->sum_loss);
    all->sd->sum_loss = (double)fVar1;
    fVar1 = accumulate_scalar(all,(float)all->sd->weighted_labeled_examples);
    all->sd->weighted_labeled_examples = (double)fVar1;
    fVar1 = accumulate_scalar(all,(float)all->sd->weighted_labels);
    all->sd->weighted_labels = (double)fVar1;
    fVar1 = accumulate_scalar(all,(float)all->sd->weighted_unlabeled_examples);
    all->sd->weighted_unlabeled_examples = (double)fVar1;
    fVar1 = accumulate_scalar(all,(float)all->sd->example_number);
    all->sd->example_number = (long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1;
    fVar1 = accumulate_scalar(all,(float)all->sd->total_features);
    all->sd->total_features = (long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f | (long)fVar1;
  }
  return;
}

Assistant:

void sync_stats(vw& all)
{
  if (all.all_reduce != nullptr)
  {
    float loss = (float)all.sd->sum_loss;
    all.sd->sum_loss = (double)accumulate_scalar(all, loss);
    float weighted_labeled_examples = (float)all.sd->weighted_labeled_examples;
    all.sd->weighted_labeled_examples = (double)accumulate_scalar(all, weighted_labeled_examples);
    float weighted_labels = (float)all.sd->weighted_labels;
    all.sd->weighted_labels = (double)accumulate_scalar(all, weighted_labels);
    float weighted_unlabeled_examples = (float)all.sd->weighted_unlabeled_examples;
    all.sd->weighted_unlabeled_examples = (double)accumulate_scalar(all, weighted_unlabeled_examples);
    float example_number = (float)all.sd->example_number;
    all.sd->example_number = (uint64_t)accumulate_scalar(all, example_number);
    float total_features = (float)all.sd->total_features;
    all.sd->total_features = (uint64_t)accumulate_scalar(all, total_features);
  }
}